

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dcfmtsym.h
# Opt level: O0

UnicodeString * __thiscall
icu_63::DecimalFormatSymbols::getConstDigitSymbol(DecimalFormatSymbols *this,int32_t digit)

{
  int local_1c;
  ENumberFormatSymbol key;
  int32_t digit_local;
  DecimalFormatSymbols *this_local;
  
  if ((digit < 0) || (local_1c = digit, 9 < digit)) {
    local_1c = 0;
  }
  if (local_1c == 0) {
    this_local = (DecimalFormatSymbols *)&this->field_0x108;
  }
  else {
    this_local = (DecimalFormatSymbols *)(&this->field_0x8 + (ulong)(local_1c + 0x11) * 0x40);
  }
  return (UnicodeString *)this_local;
}

Assistant:

inline const UnicodeString& DecimalFormatSymbols::getConstDigitSymbol(int32_t digit) const {
    if (digit < 0 || digit > 9) {
        digit = 0;
    }
    if (digit == 0) {
        return fSymbols[kZeroDigitSymbol];
    }
    ENumberFormatSymbol key = static_cast<ENumberFormatSymbol>(kOneDigitSymbol + digit - 1);
    return fSymbols[key];
}